

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimationKeyFrames
          (OgreBinarySerializer *this,Animation *anim,VertexAnimationTrack *track)

{
  pointer *__r;
  bool bVar1;
  VertexData *pVVar2;
  long lVar3;
  size_t numBytes_00;
  uint8_t *buff;
  MemoryIOStream *this_00;
  size_t num_bytes;
  bool local_b2;
  value_type local_a8;
  PoseRef pr;
  PoseKeyFrame kf_1;
  uint8_t *morphBuffer;
  size_t numBytes;
  size_t vertexSize;
  size_t vertexCount;
  bool hasNormals;
  undefined1 local_40 [8];
  MorphKeyFrame kf;
  uint16_t id;
  VertexAnimationTrack *track_local;
  Animation *anim_local;
  OgreBinarySerializer *this_local;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    kf.buffer.super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._6_2_ = ReadHeader(this,true);
    while( true ) {
      bVar1 = AtEnd(this);
      local_b2 = false;
      if (!bVar1) {
        local_b2 = kf.buffer.super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._6_2_ == 0xd111 ||
                   kf.buffer.super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._6_2_ == 0xd112;
      }
      if (!local_b2) break;
      if (kf.buffer.super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._6_2_ == 0xd111) {
        MorphKeyFrame::MorphKeyFrame((MorphKeyFrame *)local_40);
        local_40._0_4_ = Read<float>(this);
        bVar1 = Read<bool>(this);
        pVVar2 = Ogre::Animation::AssociatedVertexData(anim,track);
        lVar3 = 0xc;
        if (bVar1) {
          lVar3 = 0x18;
        }
        numBytes_00 = (ulong)(pVVar2->super_IVertexData).count * lVar3;
        num_bytes = numBytes_00;
        buff = ReadBytes(this,numBytes_00);
        this_00 = (MemoryIOStream *)
                  Intern::AllocateFromAssimpHeap::operator_new
                            ((AllocateFromAssimpHeap *)0x28,num_bytes);
        MemoryIOStream::MemoryIOStream(this_00,buff,numBytes_00,true);
        std::shared_ptr<Assimp::MemoryIOStream>::shared_ptr<Assimp::MemoryIOStream,void>
                  ((shared_ptr<Assimp::MemoryIOStream> *)
                   &kf_1.references.
                    super__Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
        __r = &kf_1.references.
               super__Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::shared_ptr<Assimp::MemoryIOStream>::operator=
                  ((shared_ptr<Assimp::MemoryIOStream> *)&kf,
                   (shared_ptr<Assimp::MemoryIOStream> *)__r);
        std::shared_ptr<Assimp::MemoryIOStream>::~shared_ptr
                  ((shared_ptr<Assimp::MemoryIOStream> *)__r);
        std::vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_>::
        push_back(&track->morphKeyFrames,(value_type *)local_40);
        MorphKeyFrame::~MorphKeyFrame((MorphKeyFrame *)local_40);
      }
      else if (kf.buffer.super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._6_2_ == 0xd112) {
        PoseKeyFrame::PoseKeyFrame((PoseKeyFrame *)&pr);
        pr._0_4_ = Read<float>(this);
        bVar1 = AtEnd(this);
        if (!bVar1) {
          kf.buffer.super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._6_2_ = ReadHeader(this,true);
          while (bVar1 = AtEnd(this),
                !bVar1 && kf.buffer.
                          super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._6_2_ == 0xd113) {
            local_a8.index = Read<unsigned_short>(this);
            local_a8.influence = Read<float>(this);
            std::vector<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>::push_back
                      ((vector<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_> *)
                       &kf_1,&local_a8);
            bVar1 = AtEnd(this);
            if (!bVar1) {
              kf.buffer.super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._6_2_ = ReadHeader(this,true);
            }
          }
          bVar1 = AtEnd(this);
          if (!bVar1) {
            RollbackHeader(this);
          }
        }
        std::vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_>::
        push_back(&track->poseKeyFrames,(value_type *)&pr);
        PoseKeyFrame::~PoseKeyFrame((PoseKeyFrame *)&pr);
      }
      bVar1 = AtEnd(this);
      if (!bVar1) {
        kf.buffer.super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._6_2_ = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadAnimationKeyFrames(Animation *anim, VertexAnimationTrack *track)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_ANIMATION_MORPH_KEYFRAME ||
             id == M_ANIMATION_POSE_KEYFRAME))
        {
            if (id == M_ANIMATION_MORPH_KEYFRAME)
            {
                MorphKeyFrame kf;
                kf.timePos = Read<float>();
                bool hasNormals = Read<bool>();

                size_t vertexCount = anim->AssociatedVertexData(track)->count;
                size_t vertexSize = sizeof(float) * (hasNormals ? 6 : 3);
                size_t numBytes = vertexCount * vertexSize;

                uint8_t *morphBuffer = ReadBytes(numBytes);
                kf.buffer = MemoryStreamPtr(new Assimp::MemoryIOStream(morphBuffer, numBytes, true));

                track->morphKeyFrames.push_back(kf);
            }
            else if (id == M_ANIMATION_POSE_KEYFRAME)
            {
                PoseKeyFrame kf;
                kf.timePos = Read<float>();

                if (!AtEnd())
                {
                    id = ReadHeader();
                    while (!AtEnd() && id == M_ANIMATION_POSE_REF)
                    {
                        PoseRef pr;
                        pr.index = Read<uint16_t>();
                        pr.influence = Read<float>();
                        kf.references.push_back(pr);

                        if (!AtEnd())
                            id = ReadHeader();
                    }
                    if (!AtEnd())
                        RollbackHeader();
                }

                track->poseKeyFrames.push_back(kf);
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}